

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.cc
# Opt level: O0

int __thiscall mp::TextFormatter::apr(TextFormatter *this,File *f,char *fmt,...)

{
  char cVar1;
  char in_AL;
  int iVar2;
  long lVar3;
  undefined8 in_RCX;
  char *pcVar4;
  char *in_RDX;
  File *in_RSI;
  TextFormatter *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  error_code eVar5;
  undefined1 auVar6 [12];
  to_chars_result res;
  va_list ap;
  int j;
  int i;
  int rc;
  double x;
  char *s;
  char buf [32];
  FILE *fd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  NLUtils *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  undefined1 local_218 [24];
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  allocator<char> local_159;
  string local_158 [32];
  string local_138 [48];
  int local_108;
  error_category *local_100;
  string local_f8 [32];
  string local_d8 [32];
  undefined1 local_b8 [12];
  undefined4 uStack_ac;
  undefined1 local_a8 [12];
  undefined4 uStack_9c;
  undefined1 *local_98;
  undefined8 local_90;
  uint local_88;
  uint local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined1 *local_78;
  undefined4 local_64;
  int local_60;
  uint local_5c;
  double local_58;
  char *local_50;
  char local_48 [31];
  char cStack_29;
  FILE *local_28;
  char *local_20;
  File *local_18;
  TextFormatter *local_10;
  
  if (in_AL != '\0') {
    local_1e8 = in_XMM0_Qa;
    local_1d8 = in_XMM1_Qa;
    local_1c8 = in_XMM2_Qa;
    local_1b8 = in_XMM3_Qa;
    local_1a8 = in_XMM4_Qa;
    local_198 = in_XMM5_Qa;
    local_188 = in_XMM6_Qa;
    local_178 = in_XMM7_Qa;
  }
  local_200 = in_RCX;
  local_1f8 = in_R8;
  local_1f0 = in_R9;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = (FILE *)File::GetHandle(in_RSI);
  local_78 = local_218;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0x00000008;
  local_84 = 0x30;
  local_88 = 0x18;
  local_5c = (uint)(*local_20 != '%');
LAB_0012084d:
  do {
    while( true ) {
      pcVar4 = local_20 + 1;
      local_60 = (int)*local_20;
      if (*local_20 == '\0') {
        return local_5c;
      }
      if (local_60 != 9) break;
      if ((in_RDI->nl_comments & 1U) == 0) {
        local_20 = pcVar4;
        putc(10,local_28);
        return local_5c;
      }
LAB_001208da:
      local_20 = pcVar4;
      putc(local_60,local_28);
    }
    if (local_60 != 0x25) goto LAB_001208da;
    local_5c = local_5c + 1;
    local_20 = local_20 + 2;
    cVar1 = *pcVar4;
    if (cVar1 == '.') {
      do {
        pcVar4 = local_20 + 1;
        cVar1 = *local_20;
        local_20 = pcVar4;
      } while (cVar1 != 'g');
LAB_00120c00:
      if (local_84 < 0xa1) {
        lVar3 = (long)(int)local_84;
        local_84 = local_84 + 0x10;
        in_stack_fffffffffffffd70 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_78 + lVar3)
        ;
      }
      else {
        in_stack_fffffffffffffd70 = local_80;
        local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_80->_M_string_length;
      }
      local_58 = *(double *)in_stack_fffffffffffffd70;
      if (in_RDI->output_prec < 1) {
        local_50 = local_48;
        auVar6 = std::to_chars(local_50,&cStack_29,local_58);
        local_98 = auVar6._0_8_;
        local_90 = CONCAT44(uStack_9c,auVar6._8_4_);
        local_a8 = auVar6;
        auVar6 = local_b8;
      }
      else {
        local_50 = local_48;
        auVar6 = std::to_chars(local_50,&cStack_29,local_58,general,in_RDI->output_prec);
        local_98 = auVar6._0_8_;
        local_90 = CONCAT44(uStack_ac,auVar6._8_4_);
      }
      local_b8 = auVar6;
      if ((int)local_90 == 0) {
        *local_98 = 0;
      }
      else {
        in_stack_fffffffffffffd60 = Utils(in_RDI);
        eVar5 = std::make_error_code(0);
        local_100 = eVar5._M_cat;
        local_108 = eVar5._M_value;
        in_stack_fffffffffffffd68 = local_f8;
        std::error_code::message_abi_cxx11_((error_code *)in_stack_fffffffffffffd48);
        std::operator+(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
        (*in_stack_fffffffffffffd60->_vptr_NLUtils[7])(in_stack_fffffffffffffd60,local_d8);
        std::__cxx11::string::~string(local_d8);
        std::__cxx11::string::~string(local_f8);
      }
LAB_00120ead:
      while( true ) {
        pcVar4 = local_50 + 1;
        local_60 = (int)*local_50;
        local_50 = pcVar4;
        if (local_60 == 0) break;
        putc(local_60,local_28);
      }
      goto LAB_0012084d;
    }
    if (cVar1 != 'c') {
      if (cVar1 == 'd') {
        if (local_88 < 0x29) {
          local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_78 + (int)local_88);
          local_88 = local_88 + 8;
        }
        else {
          local_270 = local_80;
          local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_80->_M_string_length;
        }
        local_60 = *(int *)local_270;
      }
      else {
        if (cVar1 == 'g') goto LAB_00120c00;
        if (cVar1 == 's') {
          if (local_88 < 0x29) {
            lVar3 = (long)(int)local_88;
            local_88 = local_88 + 8;
            in_stack_fffffffffffffd48 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_78 + lVar3);
          }
          else {
            in_stack_fffffffffffffd48 = local_80;
            local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_80->_M_string_length;
          }
          local_50 = *(char **)in_stack_fffffffffffffd48;
          goto LAB_00120ead;
        }
        if (cVar1 != 'z') {
          in_stack_fffffffffffffd30 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Utils(in_RDI);
          in_stack_fffffffffffffd38 = local_20 + -1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,
                     (allocator<char> *)in_stack_fffffffffffffd60);
          std::operator+(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
          (**(code **)(*(long *)in_stack_fffffffffffffd30 + 0x38))
                    (in_stack_fffffffffffffd30,local_138);
          std::__cxx11::string::~string(local_138);
          std::__cxx11::string::~string(local_158);
          std::allocator<char>::~allocator(&local_159);
          goto LAB_0012084d;
        }
        if (local_88 < 0x29) {
          local_258 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_78 + (int)local_88);
          local_88 = local_88 + 8;
        }
        else {
          local_258 = local_80;
          local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_80->_M_string_length;
        }
        local_60 = SUB84(*(double *)local_258,0);
      }
      if (local_60 < 0) {
        putc(0x2d,local_28);
        local_60 = -local_60;
      }
      local_50 = local_48;
      do {
        iVar2 = local_60 / 10;
        pcVar4 = local_50 + 1;
        *local_50 = (char)local_60 + (char)iVar2 * -10 + '0';
        local_60 = iVar2;
        local_50 = pcVar4;
      } while (iVar2 != 0);
      local_64 = 0;
      do {
        local_60 = (int)local_50[-1];
        local_50 = local_50 + -1;
        putc(local_60,local_28);
      } while (local_48 < local_50);
      goto LAB_0012084d;
    }
    if (local_88 < 0x29) {
      local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_78 + (int)local_88);
      local_88 = local_88 + 8;
    }
    else {
      local_240 = local_80;
      local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_80->_M_string_length;
    }
    local_60 = *(int *)local_240;
    putc(local_60,local_28);
  } while( true );
}

Assistant:

int TextFormatter::apr(File& f, const char *fmt, ...)
{
  auto fd = f.GetHandle();
  char buf[32], *s;
  double x;
  int rc;
  ssize_t i, j;
  va_list ap;

  rc = 0;

  va_start(ap, fmt);
  if (*fmt != '%')
    rc++;
  for(;;) {
    for(;;) {
      switch(i = *fmt++) {
      case 0:	  goto done;
      case '%': break;
      case '\t':
        if (!nl_comments) {
          putc('\n', fd);
          va_end(ap);
          return rc;
        }
        /* no break */
      default:
        putc(i, fd);
        continue;
      }
      break;
    }
    rc++;
    switch(*fmt++) {
    case 'c':
      i = va_arg(ap, int);
      putc(i, fd);
      continue;
    case 'z':
      i = va_arg(ap, size_t);
      goto have_i;
    case 'd':
      i = va_arg(ap, int);
have_i:
      if (i < 0) {
        putc('-',fd);
        i = -i;
      }
      s = buf;
      do {
        j = i / 10;
        *s++ = i - 10*j + '0';
      }
      while((i = j));
      do {
        i = *--s;
        putc(i,fd);
      }	while (s > buf);
      continue;
    case '.':
      while (*fmt++ != 'g');
    case 'g':
      x = va_arg(ap, double);
#ifndef NLW2_LIB_DMGAY_DTOA
#ifndef NL_LIB_USE_OWN_GFMT
      std::to_chars_result res;
      if (output_prec <= 0)             // shortest representation
        res = std::to_chars(s = buf, buf+sizeof(buf)-1, x);
      else                              // 24 characters enough IEEE 754
        res = std::to_chars(s = buf, buf+sizeof(buf)-1, x,
                            std::chars_format::general,
                            output_prec);
      if (res.ec == std::errc())        // OK
        *res.ptr = '\0';
      else
        Utils().myexit("aprintf / to_chars bug: " +
                       std::make_error_code(res.ec).message());
#else  // NL_LIB_USE_OWN_GFMT
      NL_LIB_GFMT::gfmt(s = buf, sizeof(buf), x, output_prec);
#endif  // NL_LIB_USE_OWN_GFMT
#else  // NLW2_LIB_DMGAY_DTOA
      s = DAVID_GAY_GFMT::gfmt(x, output_prec);
#endif
      goto have_s;
    case 's':
      s = va_arg(ap, char*);
have_s:
      while ((i = *s++))
        putc(i,fd);
      continue;
    default:
      Utils().myexit("aprintf bug: unexpected fmt: " +
                     std::string(fmt-1));
    }
  }
done:
  va_end(ap);
  return rc;
}